

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O1

maybe<unsigned_int,_void> * __thiscall
pstore::maybe<unsigned_int,_void>::operator=
          (maybe<unsigned_int,_void> *this,maybe<unsigned_int,_void> *other)

{
  type tVar1;
  type *ptVar2;
  
  if (other != this) {
    if (other->valid_ == false) {
      if (this->valid_ == true) {
        this->valid_ = false;
      }
    }
    else {
      ptVar2 = (type *)maybe<unsigned_int,void>::
                       value_impl<pstore::maybe<unsigned_int,void>&,unsigned_int>(other);
      if (this->valid_ == true) {
        tVar1 = *ptVar2;
        ptVar2 = (type *)maybe<unsigned_int,void>::
                         value_impl<pstore::maybe<unsigned_int,void>&,unsigned_int>(this);
        *ptVar2 = tVar1;
      }
      else {
        this->storage_ = *ptVar2;
        this->valid_ = true;
      }
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }